

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

string * __thiscall
tinyusdz::tydra::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tydra *this,VertexAttributeFormat f)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar1 = "bool";
    break;
  case 1:
    pcVar1 = "int8";
    break;
  case 2:
    pcVar1 = "int8x2";
    break;
  case 3:
    pcVar1 = "int8x3";
    break;
  case 4:
    pcVar1 = "int8x4";
    break;
  case 5:
    pcVar1 = "uint8";
    break;
  case 6:
    pcVar1 = "uint8x2";
    break;
  case 7:
    pcVar1 = "uint8x3";
    break;
  case 8:
    pcVar1 = "uint8x4";
    break;
  case 9:
    pcVar1 = "int16";
    break;
  case 10:
  case 0xb:
  case 0xc:
    pcVar1 = "int16x2";
    break;
  case 0xd:
    pcVar1 = "uint16";
    break;
  case 0xe:
  case 0xf:
  case 0x10:
    pcVar1 = "uint16x2";
    break;
  case 0x11:
    pcVar1 = "half";
    break;
  case 0x12:
    pcVar1 = "half2";
    break;
  case 0x13:
    pcVar1 = "half3";
    break;
  case 0x14:
    pcVar1 = "half4";
    break;
  case 0x15:
    pcVar1 = "float";
    break;
  case 0x16:
    pcVar1 = "float2";
    break;
  case 0x17:
    pcVar1 = "float3";
    break;
  case 0x18:
    pcVar1 = "float4";
    break;
  case 0x19:
    pcVar1 = "int";
    break;
  case 0x1a:
    pcVar1 = "int2";
    break;
  case 0x1b:
    pcVar1 = "int3";
    break;
  case 0x1c:
    pcVar1 = "int4";
    break;
  case 0x1d:
    pcVar1 = "uint";
    break;
  case 0x1e:
    pcVar1 = "uint2";
    break;
  case 0x1f:
    pcVar1 = "uint3";
    break;
  case 0x20:
    pcVar1 = "uint4";
    break;
  case 0x21:
    pcVar1 = "double";
    break;
  case 0x22:
    pcVar1 = "double2";
    break;
  case 0x23:
    pcVar1 = "double3";
    break;
  case 0x24:
    pcVar1 = "double4";
    break;
  case 0x25:
    pcVar1 = "mat2";
    break;
  case 0x26:
    pcVar1 = "mat3";
    break;
  case 0x27:
    pcVar1 = "mat4";
    break;
  case 0x28:
    pcVar1 = "dmat2";
    break;
  case 0x29:
    pcVar1 = "dmat3";
    break;
  case 0x2a:
    pcVar1 = "dmat4";
    break;
  default:
    goto switchD_0036183a_default;
  }
  ::std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar1);
switchD_0036183a_default:
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(VertexAttributeFormat f) {
  std::string s;

  switch (f) {
    case VertexAttributeFormat::Bool: {
      s = "bool";
      break;
    }
    case VertexAttributeFormat::Char: {
      s = "int8";
      break;
    }
    case VertexAttributeFormat::Char2: {
      s = "int8x2";
      break;
    }
    case VertexAttributeFormat::Char3: {
      s = "int8x3";
      break;
    }
    case VertexAttributeFormat::Char4: {
      s = "int8x4";
      break;
    }
    case VertexAttributeFormat::Byte: {
      s = "uint8";
      break;
    }
    case VertexAttributeFormat::Byte2: {
      s = "uint8x2";
      break;
    }
    case VertexAttributeFormat::Byte3: {
      s = "uint8x3";
      break;
    }
    case VertexAttributeFormat::Byte4: {
      s = "uint8x4";
      break;
    }
    case VertexAttributeFormat::Short: {
      s = "int16";
      break;
    }
    case VertexAttributeFormat::Short2: {
      s = "int16x2";
      break;
    }
    case VertexAttributeFormat::Short3: {
      s = "int16x2";
      break;
    }
    case VertexAttributeFormat::Short4: {
      s = "int16x2";
      break;
    }
    case VertexAttributeFormat::Ushort: {
      s = "uint16";
      break;
    }
    case VertexAttributeFormat::Ushort2: {
      s = "uint16x2";
      break;
    }
    case VertexAttributeFormat::Ushort3: {
      s = "uint16x2";
      break;
    }
    case VertexAttributeFormat::Ushort4: {
      s = "uint16x2";
      break;
    }
    case VertexAttributeFormat::Half: {
      s = "half";
      break;
    }
    case VertexAttributeFormat::Half2: {
      s = "half2";
      break;
    }
    case VertexAttributeFormat::Half3: {
      s = "half3";
      break;
    }
    case VertexAttributeFormat::Half4: {
      s = "half4";
      break;
    }
    case VertexAttributeFormat::Float: {
      s = "float";
      break;
    }
    case VertexAttributeFormat::Vec2: {
      s = "float2";
      break;
    }
    case VertexAttributeFormat::Vec3: {
      s = "float3";
      break;
    }
    case VertexAttributeFormat::Vec4: {
      s = "float4";
      break;
    }
    case VertexAttributeFormat::Int: {
      s = "int";
      break;
    }
    case VertexAttributeFormat::Ivec2: {
      s = "int2";
      break;
    }
    case VertexAttributeFormat::Ivec3: {
      s = "int3";
      break;
    }
    case VertexAttributeFormat::Ivec4: {
      s = "int4";
      break;
    }
    case VertexAttributeFormat::Uint: {
      s = "uint";
      break;
    }
    case VertexAttributeFormat::Uvec2: {
      s = "uint2";
      break;
    }
    case VertexAttributeFormat::Uvec3: {
      s = "uint3";
      break;
    }
    case VertexAttributeFormat::Uvec4: {
      s = "uint4";
      break;
    }
    case VertexAttributeFormat::Double: {
      s = "double";
      break;
    }
    case VertexAttributeFormat::Dvec2: {
      s = "double2";
      break;
    }
    case VertexAttributeFormat::Dvec3: {
      s = "double3";
      break;
    }
    case VertexAttributeFormat::Dvec4: {
      s = "double4";
      break;
    }
    case VertexAttributeFormat::Mat2: {
      s = "mat2";
      break;
    }
    case VertexAttributeFormat::Mat3: {
      s = "mat3";
      break;
    }
    case VertexAttributeFormat::Mat4: {
      s = "mat4";
      break;
    }
    case VertexAttributeFormat::Dmat2: {
      s = "dmat2";
      break;
    }
    case VertexAttributeFormat::Dmat3: {
      s = "dmat3";
      break;
    }
    case VertexAttributeFormat::Dmat4: {
      s = "dmat4";
      break;
    }
  }

  return s;
}